

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O0

void constructor_set(constructor ctor,size_t index,char *name,type t)

{
  int iVar1;
  constructor_node pcVar2;
  size_t sVar3;
  char *pcVar4;
  type in_RCX;
  char *in_RDX;
  ulong in_RSI;
  long in_RDI;
  char *name_node;
  size_t name_size;
  constructor_node node;
  size_t in_stack_ffffffffffffffd0;
  constructor in_stack_ffffffffffffffd8;
  
  if (((in_RDI != 0) && (in_RSI < *(ulong *)(in_RDI + 0x10))) && (in_RDX != (char *)0x0)) {
    pcVar2 = constructor_at(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    sVar3 = strlen(in_RDX);
    sVar3 = sVar3 + 1;
    pcVar4 = (char *)malloc(sVar3);
    if (pcVar4 == (char *)0x0) {
      log_write_impl_va("metacall",0xb3,"constructor_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_constructor.c"
                        ,3,"Invalid constructor name allocation");
    }
    else {
      if (pcVar2->name != (char *)0x0) {
        free(pcVar2->name);
      }
      pcVar2->name = pcVar4;
      memcpy(pcVar2->name,in_RDX,sVar3);
      pcVar2->t = in_RCX;
      pcVar2->index = in_RSI;
      iVar1 = set_insert(*(undefined8 *)(in_RDI + 8),pcVar2->name,pcVar2);
      if (iVar1 != 0) {
        free(pcVar2->name);
        pcVar2->index = 0xffffffffffffffff;
        pcVar2->name = (char *)0x0;
        pcVar2->t = (type)0x0;
        log_write_impl_va("metacall",0xcd,"constructor_set",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_constructor.c"
                          ,3,"Invalid constructor set insertion");
      }
    }
  }
  return;
}

Assistant:

void constructor_set(constructor ctor, size_t index, const char *name, type t)
{
	if (ctor != NULL && index < ctor->count && name != NULL)
	{
		constructor_node node = constructor_at(ctor, index);

		size_t name_size = strlen(name) + 1;

		char *name_node = malloc(sizeof(char) * name_size);

		if (name_node == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid constructor name allocation");

			return;
		}

		if (node->name != NULL)
		{
			free(node->name);
		}

		node->name = name_node;

		memcpy(node->name, name, name_size);

		node->t = t;

		node->index = index;

		if (set_insert(ctor->map, (set_key)node->name, (set_value)node) != 0)
		{
			free(node->name);

			node->index = REFLECT_CONSTRUCTOR_INVALID_INDEX;
			node->name = NULL;
			node->t = NULL;

			log_write("metacall", LOG_LEVEL_ERROR, "Invalid constructor set insertion");
		}
	}
}